

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pragma_version.cpp
# Opt level: O3

void duckdb::PragmaVersionFunction
               (ClientContext *context,TableFunctionInput *data_p,DataChunk *output)

{
  GlobalTableFunctionState *pGVar1;
  Value VStack_58;
  
  optional_ptr<duckdb::GlobalTableFunctionState,_true>::CheckValid(&data_p->global_state);
  pGVar1 = (data_p->global_state).ptr;
  if (*(char *)&pGVar1[1]._vptr_GlobalTableFunctionState == '\0') {
    output->count = 1;
    Value::Value(&VStack_58,"v1.3.0-dev2743");
    DataChunk::SetValue(output,0,0,&VStack_58);
    Value::~Value(&VStack_58);
    Value::Value(&VStack_58,"0069af20ab");
    DataChunk::SetValue(output,1,0,&VStack_58);
    Value::~Value(&VStack_58);
    *(undefined1 *)&pGVar1[1]._vptr_GlobalTableFunctionState = 1;
  }
  return;
}

Assistant:

static void PragmaVersionFunction(ClientContext &context, TableFunctionInput &data_p, DataChunk &output) {
	auto &data = data_p.global_state->Cast<PragmaVersionData>();
	if (data.finished) {
		// finished returning values
		return;
	}
	output.SetCardinality(1);
	output.SetValue(0, 0, DuckDB::LibraryVersion());
	output.SetValue(1, 0, DuckDB::SourceID());
	data.finished = true;
}